

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_pixel_late(Impl *this)

{
  Builder *this_00;
  Function *pFVar1;
  Builder *builder;
  Impl *this_local;
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  if (((this->execution_mode_meta).declares_rov & 1U) != 0) {
    spv::Builder::addExtension(this_00,"SPV_EXT_fragment_shader_interlock");
    if (((this->execution_mode_meta).per_sample_shading & 1U) == 0) {
      spv::Builder::addCapability(this_00,CapabilityFragmentShaderPixelInterlockEXT);
      pFVar1 = SPIRVModule::get_entry_function(this->spirv_module);
      spv::Builder::addExecutionMode(this_00,pFVar1,ExecutionModePixelInterlockOrderedEXT,-1,-1,-1);
    }
    else {
      spv::Builder::addCapability(this_00,CapabilityFragmentShaderSampleInterlockEXT);
      pFVar1 = SPIRVModule::get_entry_function(this->spirv_module);
      spv::Builder::addExecutionMode(this_00,pFVar1,ExecutionModeSampleInterlockOrderedEXT,-1,-1,-1)
      ;
    }
  }
  return true;
}

Assistant:

bool Converter::Impl::emit_execution_modes_pixel_late()
{
	auto &builder = spirv_module.get_builder();

	if (execution_mode_meta.declares_rov)
	{
		builder.addExtension("SPV_EXT_fragment_shader_interlock");
		if (execution_mode_meta.per_sample_shading)
		{
			builder.addCapability(spv::CapabilityFragmentShaderSampleInterlockEXT);
			builder.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeSampleInterlockOrderedEXT);
		}
		else
		{
			builder.addCapability(spv::CapabilityFragmentShaderPixelInterlockEXT);
			builder.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModePixelInterlockOrderedEXT);
		}
	}

	return true;
}